

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O0

size_t __thiscall BamTools::Internal::RollingBuffer::Read(RollingBuffer *this,char *dest,size_t max)

{
  unsigned_long *puVar1;
  char *__src;
  long in_RSI;
  RollingBuffer *in_RDI;
  size_t blockBytes;
  char *readPtr;
  size_t bytesReadSoFar;
  size_t bytesToRead;
  size_t local_50;
  RollingBuffer *in_stack_ffffffffffffffb8;
  RollingBuffer *this_00;
  ulong local_30;
  size_t local_28;
  ulong local_20;
  unsigned_long local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = Size(in_RDI);
  puVar1 = std::min<unsigned_long>(&local_28,&local_18);
  local_20 = *puVar1;
  local_30 = 0;
  while (local_30 < local_20) {
    __src = ReadPointer(in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = (RollingBuffer *)(local_20 - local_30);
    local_50 = BlockSize(in_stack_ffffffffffffffb8);
    puVar1 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffb8,&local_50);
    this_00 = (RollingBuffer *)*puVar1;
    if (local_10 != 0) {
      memcpy((void *)(local_10 + local_30),__src,(size_t)this_00);
    }
    local_30 = (long)&this_00->m_head + local_30;
    Free(this_00,(size_t)in_stack_ffffffffffffffb8);
  }
  return local_30;
}

Assistant:

std::size_t RollingBuffer::Read(char* dest, std::size_t max)
{

    std::size_t bytesToRead = std::min(Size(), max);
    std::size_t bytesReadSoFar = 0;

    while (bytesReadSoFar < bytesToRead) {
        const char* readPtr = ReadPointer();
        std::size_t blockBytes = std::min((bytesToRead - bytesReadSoFar), BlockSize());
        if (dest) {
            std::memcpy(dest + bytesReadSoFar, readPtr, blockBytes);
        }
        bytesReadSoFar += blockBytes;
        Free(blockBytes);
    }

    return bytesReadSoFar;
}